

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O0

pos_type __thiscall
avro::istreambuf::seekoff(istreambuf *this,off_type off,seekdir dir,openmode param_4)

{
  long lVar1;
  long lVar2;
  long lVar3;
  InputBuffer *this_00;
  size_type sVar4;
  char *__off;
  fpos<__mbstate_t> *this_01;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  off_type endpos;
  off_type newpos;
  off_type curpos;
  streamoff in_stack_ffffffffffffff48;
  fpos<__mbstate_t> *in_stack_ffffffffffffff50;
  istreambuf *this_02;
  istreambuf *in_stack_ffffffffffffffa0;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  pos_type local_10;
  
  lVar3 = *(long *)(in_RDI + 0x50);
  lVar1 = std::streambuf::gptr();
  lVar2 = std::streambuf::eback();
  lVar3 = lVar3 + (lVar1 - lVar2);
  if (in_EDX == 1) {
    local_38 = lVar3 + in_RSI;
  }
  else {
    local_38 = in_RSI;
    if (in_EDX == 2) {
      sVar4 = InputBuffer::size((InputBuffer *)0x2b0606);
      local_38 = sVar4 + in_RSI;
    }
  }
  if (local_38 == lVar3) {
    std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    this_02 = *(istreambuf **)(in_RDI + 0x50);
    this_00 = (InputBuffer *)std::streambuf::egptr();
    lVar3 = std::streambuf::eback();
    local_40 = (long)this_02 + ((long)this_00 - lVar3);
    if ((local_40 < local_38) &&
       (sVar4 = InputBuffer::size((InputBuffer *)0x2b06a8), (long)sVar4 < local_38)) {
      std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      if (local_38 < *(long *)(in_RDI + 0x50)) {
        InputBuffer::begin(this_00);
        *(istreambuf **)(in_RDI + 0x58) = in_stack_ffffffffffffffa0;
        *(undefined8 *)(in_RDI + 0x60) = local_58;
        *(undefined8 *)(in_RDI + 0x68) = local_50;
        *(undefined8 *)(in_RDI + 0x70) = local_48;
        in_RDI[0x50] = '\0';
        in_RDI[0x51] = '\0';
        in_RDI[0x52] = '\0';
        in_RDI[0x53] = '\0';
        in_RDI[0x54] = '\0';
        in_RDI[0x55] = '\0';
        in_RDI[0x56] = '\0';
        in_RDI[0x57] = '\0';
        setBuffer(in_stack_ffffffffffffffa0);
        local_40 = std::streambuf::egptr();
        lVar3 = std::streambuf::eback();
        local_40 = local_40 - lVar3;
      }
      for (; local_40 < local_38; local_40 = local_40 + (lVar3 - lVar1)) {
        underflow(this_02);
        local_40 = *(long *)(in_RDI + 0x50);
        lVar3 = std::streambuf::egptr();
        lVar1 = std::streambuf::eback();
      }
      __off = (char *)std::streambuf::eback();
      lVar3 = std::streambuf::eback();
      this_01 = (fpos<__mbstate_t> *)(lVar3 + (local_38 - *(long *)(in_RDI + 0x50)));
      std::streambuf::egptr();
      std::streambuf::setg(in_RDI,__off,(char *)this_01);
      std::fpos<__mbstate_t>::fpos(this_01,(streamoff)__off);
    }
  }
  return local_10;
}

Assistant:

virtual pos_type seekoff(off_type off, std::ios::seekdir dir, std::ios_base::openmode) {

        off_type curpos = basePos_ + (gptr() - eback()); 
        off_type newpos = off;

        if(dir == std::ios::cur) {
            newpos += curpos;
        }
        else if (dir == std::ios::end) {
            newpos += buffer_.size();
        }
        // short circuit for tell()  
        if(newpos == curpos) {
            return curpos;
        }

        off_type endpos = basePos_ + (egptr() - eback());

        // if the position is after our current buffer make
        // sure it's not past the end of the buffer
        if((newpos > endpos) && (newpos > static_cast<off_type>(buffer_.size()) )) {
            return pos_type(-1);
        }
        // if the new position is before our current iterator
        // reset the iterator to the beginning
        else if (newpos < basePos_) {
            iter_ = buffer_.begin();
            basePos_ = 0;
            setBuffer();
            endpos = (egptr() -eback());
        }

        // now if the new position is after the end of the buffer
        // increase the buffer until it is not
        while (newpos > endpos) {
            istreambuf::underflow();
            endpos = basePos_ + (egptr() - eback()); 
        }

        setg(eback(), eback() + (newpos - basePos_), egptr());
        return newpos;
    }